

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

void __thiscall
QPDF::processFile(QPDF *this,char *description,FILE *filep,bool close_file,char *password)

{
  FileInputSource *this_00;
  shared_ptr<InputSource> local_58 [2];
  FileInputSource *local_38;
  FileInputSource *fi;
  char *password_local;
  FILE *pFStack_20;
  bool close_file_local;
  FILE *filep_local;
  char *description_local;
  QPDF *this_local;
  
  fi = (FileInputSource *)password;
  password_local._7_1_ = close_file;
  pFStack_20 = filep;
  filep_local = (FILE *)description;
  description_local = (char *)this;
  this_00 = (FileInputSource *)operator_new(0xd8);
  FileInputSource::FileInputSource
            (this_00,(char *)filep_local,pFStack_20,(bool)(password_local._7_1_ & 1));
  local_38 = this_00;
  std::shared_ptr<InputSource>::shared_ptr<FileInputSource,void>(local_58,this_00);
  processInputSource(this,local_58,(char *)fi);
  std::shared_ptr<InputSource>::~shared_ptr(local_58);
  return;
}

Assistant:

void
QPDF::processFile(char const* description, FILE* filep, bool close_file, char const* password)
{
    auto* fi = new FileInputSource(description, filep, close_file);
    processInputSource(std::shared_ptr<InputSource>(fi), password);
}